

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O3

int PUSH_NEXT(xmlNodePtr *dst,size_t size,TEMP_STORAGE_T *store,size_t minrun,
             TIM_SORT_RUN_T *run_stack,size_t *stack_curr,size_t *curr)

{
  long lVar1;
  xmlNodePtr node2;
  xmlNodePtr pxVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  uVar7 = *curr;
  uVar5 = size - uVar7;
  uVar8 = 1;
  if (uVar5 != 1) {
    if (uVar7 < size - 2) {
      lVar9 = uVar7 + 2;
      iVar4 = xmlXPathCmpNodesExt(dst[uVar7],dst[uVar7 + 1]);
      lVar1 = size - 1;
      if (iVar4 < 0 && iVar4 != -2) {
        if (lVar9 != lVar1) {
          uVar8 = uVar7;
          do {
            iVar4 = xmlXPathCmpNodesExt(dst[uVar8 + 1],dst[uVar8 + 2]);
            if ((iVar4 == -2) || (-1 < iVar4)) {
              lVar9 = uVar8 + 2;
              break;
            }
            uVar8 = uVar8 + 1;
            lVar9 = lVar1;
          } while (size - 3 != uVar8);
        }
        if (uVar7 < lVar9 - 1U) {
          uVar8 = lVar9 - 2;
          uVar6 = uVar7;
          do {
            pxVar2 = dst[uVar6];
            dst[uVar6] = dst[uVar8 + 1];
            dst[uVar8 + 1] = pxVar2;
            uVar6 = uVar6 + 1;
            bVar10 = uVar6 < uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar10);
        }
      }
      else if (lVar9 != lVar1) {
        uVar8 = uVar7;
        do {
          iVar4 = xmlXPathCmpNodesExt(dst[uVar8 + 1],dst[uVar8 + 2]);
          if (iVar4 != -2 && iVar4 < 0) {
            lVar9 = uVar8 + 2;
            break;
          }
          uVar8 = uVar8 + 1;
          lVar9 = lVar1;
        } while (size - 3 != uVar8);
      }
      uVar8 = lVar9 - uVar7;
    }
    else {
      pxVar2 = dst[size - 2];
      node2 = dst[size - 1];
      iVar4 = xmlXPathCmpNodesExt(pxVar2,node2);
      uVar8 = 2;
      if (iVar4 < 0 && iVar4 != -2) {
        dst[size - 2] = node2;
        dst[size - 1] = pxVar2;
      }
    }
  }
  if (uVar5 < minrun) {
    minrun = uVar5;
  }
  if (uVar8 < minrun) {
    libxml_domnode_binary_insertion_sort_start(dst + uVar7,uVar8,minrun);
    uVar7 = *curr;
    uVar8 = minrun;
  }
  run_stack[*stack_curr].start = uVar7;
  run_stack[*stack_curr].length = uVar8;
  *stack_curr = *stack_curr + 1;
  sVar3 = *curr;
  *curr = uVar8 + sVar3;
  iVar4 = 1;
  if (uVar8 + sVar3 == size) {
    uVar7 = *stack_curr;
    while (1 < uVar7) {
      libxml_domnode_tim_sort_merge(dst,run_stack,(int)uVar7,store);
      run_stack[*stack_curr - 2].length =
           run_stack[*stack_curr - 2].length + run_stack[*stack_curr - 1].length;
      uVar7 = *stack_curr - 1;
      *stack_curr = uVar7;
    }
    iVar4 = 0;
    if (store->storage != (xmlNodePtr *)0x0) {
      free(store->storage);
      store->storage = (xmlNodePtr *)0x0;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static __inline int PUSH_NEXT(SORT_TYPE *dst,
                              const size_t size,
                              TEMP_STORAGE_T *store,
                              const size_t minrun,
                              TIM_SORT_RUN_T *run_stack,
                              size_t *stack_curr,
                              size_t *curr) {
  size_t len = COUNT_RUN(dst, *curr, size);
  size_t run = minrun;

  if (run > size - *curr) {
    run = size - *curr;
  }

  if (run > len) {
    BINARY_INSERTION_SORT_START(&dst[*curr], len, run);
    len = run;
  }

  run_stack[*stack_curr].start = *curr;
  run_stack[*stack_curr].length = len;
  (*stack_curr)++;
  *curr += len;

  if (*curr == size) {
    /* finish up */
    while (*stack_curr > 1) {
      TIM_SORT_MERGE(dst, run_stack, *stack_curr, store);
      run_stack[*stack_curr - 2].length += run_stack[*stack_curr - 1].length;
      (*stack_curr)--;
    }

    if (store->storage != NULL) {
      free(store->storage);
      store->storage = NULL;
    }

    return 0;
  }

  return 1;
}